

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>_> *this,
          TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *geo,int matind,TPZGeoMesh *mesh)

{
  TPZRegisterClassId *in_RDI;
  int i;
  TPZGeoEl *in_stack_000001d8;
  TPZGeoBlend<pzgeom::TPZGeoQuad> *in_stack_000001e0;
  TPZGeoElSideIndex *in_stack_ffffffffffffff50;
  TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  TPZRegisterClassId *local_78;
  TPZGeoElSideIndex local_58;
  int local_40;
  undefined8 local_30;
  undefined8 local_28;
  
  local_28 = 0;
  local_30 = 0x21;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02468f30);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     (TPZGeoMesh *)in_stack_ffffffffffffff58);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02468c18;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02468c18;
  pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_>::TPZQuadSphere
            ((TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58
            );
  local_78 = in_RDI + 0xae8;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    local_78 = local_78 + 0x18;
  } while (local_78 != in_RDI + 0xbc0);
  for (local_40 = 0; local_40 < 9; local_40 = local_40 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_40 * 0x18 + 0xae8),&local_58);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x17bec48);
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>::Initialize(in_stack_000001e0,in_stack_000001d8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}